

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_map.cpp
# Opt level: O1

bool PIT_CheckThing(FMultiBlockThingsIterator *it,CheckResult *cres,FBoundingBox *box,
                   FCheckPosition *tm)

{
  double *pdVar1;
  uint uVar2;
  AActor *other;
  PClass *pPVar3;
  AActor *pAVar4;
  undefined1 *puVar5;
  bool bVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  AActor *pAVar10;
  Node *pNVar11;
  Node *pNVar12;
  AActor *pAVar13;
  byte bVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  DVector3 oldpos;
  int local_a4;
  DVector3 local_a0;
  double local_88;
  undefined1 local_80 [8];
  FName local_78;
  FName local_74;
  FName local_70;
  FName local_6c;
  FSoundID local_68;
  FName local_64;
  FName local_60;
  FName local_5c;
  DAngle local_58;
  DAngle local_50;
  DAngle local_48;
  DAngle local_40;
  DAngle local_38;
  
  other = cres->thing;
  pAVar10 = tm->thing;
  if (other == pAVar10) {
    return (bool)1;
  }
  if ((((other->flags).Value & 7) == 0) && (((other->flags6).Value & 0x200) == 0)) {
    return (bool)1;
  }
  dVar15 = other->radius + pAVar10->radius;
  if (dVar15 <= ABS((other->__Pos).X - (cres->Position).X)) {
    return (bool)1;
  }
  if (dVar15 <= ABS((other->__Pos).Y - (cres->Position).Y)) {
    return (bool)1;
  }
  if ((((other->flags2).Value | (pAVar10->flags2).Value) >> 0x14 & 1) != 0) {
    return (bool)1;
  }
  if (((pAVar10->flags6).Value & 2) != 0) {
    (*(pAVar10->super_DThinker).super_DObject._vptr_DObject[0x21])(&local_a0);
    (*(other->super_DThinker).super_DObject._vptr_DObject[0x21])(&local_a4,other);
    if (local_a0.X._0_4_ == local_a4) {
      return (bool)1;
    }
  }
  pAVar10 = tm->thing;
  pAVar10->BlockingMobj = other;
  dVar15 = (other->__Pos).Z + other->Height;
  if ((cres->portalflags & 0x80) == 0) {
    if (((((((byte)i_compatflags & 0x10) == 0) && (((pAVar10->flags).Value & 0x1014200) == 0)) &&
         (((other->flags).Value & 2) != 0)) &&
        ((((other->flags4).Value & 0x80) != 0 && (((pAVar10->flags3).Value & 0x2000) != 0)))) &&
       ((tm->floorz <= dVar15 && (dVar15 <= (pAVar10->__Pos).Z + pAVar10->MaxStepHeight)))) {
      tm->stepthing = other;
      tm->floorz = dVar15;
    }
    if (((tm->FromPMove == false) && (pAVar10->player == (player_t *)0x0)) ||
       (((other->flags).Value & 2) == 0)) goto LAB_0050cafe;
    AActor::PosRelative(&local_a0,pAVar10,other);
    dVar17 = (tm->pos).X;
    pAVar10 = tm->thing;
    if ((dVar17 != (pAVar10->__Pos).X) || (NAN(dVar17) || NAN((pAVar10->__Pos).X))) {
LAB_0050cb40:
      dVar17 = (other->__Pos).X;
      dVar18 = other->radius + pAVar10->radius;
      if ((ABS(dVar17 - local_a0.X) < dVar18) &&
         (dVar16 = (other->__Pos).Y, ABS(dVar16 - local_a0.Y) < dVar18)) {
        dVar17 = dVar17 - (cres->Position).X;
        dVar16 = dVar16 - (cres->Position).Y;
        local_88 = c_sqrt(dVar16 * dVar16 + dVar17 * dVar17);
        dVar18 = (other->__Pos).X - local_a0.X;
        dVar17 = (other->__Pos).Y - local_a0.Y;
        dVar17 = c_sqrt(dVar17 * dVar17 + dVar18 * dVar18);
        if (dVar17 < local_88) {
          pAVar10 = tm->thing;
          dVar17 = (pAVar10->__Pos).Z;
          dVar18 = pAVar10->Height + dVar17;
          pdVar1 = &(other->__Pos).Z;
          if ((dVar18 < *pdVar1 || dVar18 == *pdVar1) || (bVar14 = 1, dVar15 <= dVar17)) {
            bVar14 = (byte)((other->flags3).Value >> 8) & (byte)((pAVar10->flags3).Value >> 8) & 1;
          }
          goto LAB_0050cc3b;
        }
      }
      bVar14 = 0;
    }
    else {
      dVar17 = (tm->pos).Y;
      bVar14 = 1;
      pdVar1 = &(pAVar10->__Pos).Y;
      if ((dVar17 != *pdVar1) || (NAN(dVar17) || NAN(*pdVar1))) goto LAB_0050cb40;
    }
  }
  else {
LAB_0050cafe:
    bVar14 = 0;
  }
LAB_0050cc3b:
  pAVar10 = tm->thing;
  uVar9 = (pAVar10->flags2).Value;
  if (((((uVar9 >> 0xc & 1) != 0) || (((other->flags4).Value & 0x80) != 0)) &&
      (((byte)i_compatflags & 0x10) == 0)) &&
     ((((uVar9 >> 8 & 1) == 0 || (((pAVar10->flags).Value & 0x10000) == 0)) ||
      ((((other->flags5).Value & 0x80000) != 0 ||
       ((((pAVar10->flags6).Value & 1) != 0 && (((other->flags2).Value & 0x8000) != 0)))))))) {
    if ((((other->flags3).Value & (pAVar10->flags3).Value) >> 8 & 1) != 0) {
      return (bool)bVar14;
    }
    dVar17 = (pAVar10->__Pos).Z;
    if (dVar15 <= dVar17) {
      return (bool)1;
    }
    if (dVar17 + pAVar10->Height <= (other->__Pos).Z) {
      return (bool)1;
    }
  }
  if ((pAVar10->player == (player_t *)0x0) || ((pAVar10->player->cheats & 0x2000) == 0)) {
    uVar9 = (other->flags6).Value;
    if ((((uVar9 >> 9 & 1) != 0) && ((((pAVar10->flags).Value & 2) != 0 && (0 < other->health)))) &&
       (((uVar9 >> 0xd & 1) != 0 || (bVar6 = AActor::IsSentient(other), bVar6)))) {
      if (other->player == (player_t *)0x0) {
        if ((other->super_DThinker).super_DObject.Class == (PClass *)0x0) {
          iVar7 = (**(other->super_DThinker).super_DObject._vptr_DObject)(other);
          (other->super_DThinker).super_DObject.Class = (PClass *)CONCAT44(extraout_var,iVar7);
        }
        pPVar3 = (other->super_DThinker).super_DObject.Class;
        pAVar10 = tm->thing;
        if ((pAVar10->super_DThinker).super_DObject.Class == (PClass *)0x0) {
          iVar7 = (**(pAVar10->super_DThinker).super_DObject._vptr_DObject)(pAVar10);
          (pAVar10->super_DThinker).super_DObject.Class = (PClass *)CONCAT44(extraout_var_00,iVar7);
        }
        if (pPVar3 == (pAVar10->super_DThinker).super_DObject.Class) goto LAB_0050ce82;
      }
      if (((other->flags6).Value & 0x40) != 0) {
        (*(other->super_DThinker).super_DObject._vptr_DObject[0x21])(&local_a0,other);
        (*(tm->thing->super_DThinker).super_DObject._vptr_DObject[0x21])(&local_a4);
        if (local_a0.X._0_4_ == local_a4) goto LAB_0050ce82;
      }
      pAVar10 = tm->thing;
      dVar17 = (pAVar10->__Pos).Z;
      if ((dVar17 <= dVar15) && ((other->__Pos).Z <= dVar17 + pAVar10->Height)) {
        pAVar13 = (other->master).field_0.p;
        if ((pAVar13 != (AActor *)0x0) &&
           (((pAVar13->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0)) {
          (other->master).field_0.p = (AActor *)0x0;
          pAVar13 = (AActor *)0x0;
        }
        if (pAVar13 != pAVar10) {
          pAVar10 = (tm->thing->master).field_0.p;
          if ((pAVar10 != (AActor *)0x0) &&
             (((pAVar10->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0)) {
            (tm->thing->master).field_0.p = (AActor *)0x0;
            pAVar10 = (AActor *)0x0;
          }
          if (pAVar10 != other) {
            puVar5 = (undefined1 *)((long)&(other->flags6).Value + 1);
            *puVar5 = *puVar5 & 0xdf;
            local_5c.Index = 0;
            local_38.Degrees = 0.0;
            P_DamageMobj(other,(AActor *)0x0,(AActor *)0x0,other->health,&local_5c,8,&local_38);
            return (bool)1;
          }
        }
      }
    }
LAB_0050ce82:
    if ((((other->flags6).Value & 0x20) != 0) &&
       ((((pAVar10 = tm->thing, pAVar10->player != (player_t *)0x0 ||
          (((other->activationtype & 8U) != 0 && (((pAVar10->flags3).Value & 0x2000) != 0)))) ||
         (((other->activationtype & 0x10U) != 0 && (((pAVar10->flags).Value & 0x10000) != 0)))) &&
        ((other->lastbump < level.maptime &&
         (bVar6 = P_ActivateThingSpecial(other,pAVar10,false), bVar6)))))) {
      other->lastbump = level.maptime + 0x23;
    }
  }
  pAVar10 = tm->thing;
  uVar9 = (pAVar10->flags).Value;
  if ((uVar9 >> 0x18 & 1) != 0) {
    iVar7 = (*(pAVar10->super_DThinker).super_DObject._vptr_DObject[0x15])
                      (pAVar10,pAVar10->BlockingMobj);
    tm->thing->BlockingMobj = (AActor *)0x0;
    return (bool)(byte)iVar7;
  }
  if ((pAVar10->player != (player_t *)0x0) && ((pAVar10->player->cheats & 0x2000) != 0)) {
    bVar6 = true;
    if (((other->flags).Value & 0x1002) == 2) {
      if ((uVar9 & 2) == 0) {
        bVar6 = ((pAVar10->flags6).Value & 0x80000) == 0;
      }
      else {
        bVar6 = false;
      }
    }
    return (bool)(bVar14 | bVar6);
  }
  uVar2 = (pAVar10->flags2).Value;
  if (((((uVar2 & 8) == 0) || (((other->flags).Value & 4) == 0)) ||
      (((other->flags2).Value & 0x8000) != 0)) || (((other->flags3).Value & 0x12000) != 0x2000)) {
    if (((uVar9 >> 0x10 & 1) == 0) &&
       (((uVar9 & 2) != 0 || (((pAVar10->BounceFlags).Value & 0x1000) == 0)))) {
      if (((uVar2 >> 0xd & 1) == 0) &&
         ((((other->flags2).Value & 0x200) != 0 && (iVar7 = tm->PushTime, other->lastpush != iVar7))
         )) {
        dVar15 = other->pushfactor;
        dVar17 = (pAVar10->Vel).Y;
        (other->Vel).X = (pAVar10->Vel).X * dVar15 + (other->Vel).X;
        (other->Vel).Y = dVar15 * dVar17 + (other->Vel).Y;
        other->lastpush = iVar7;
      }
      uVar2 = (other->flags).Value;
      bVar6 = true;
      if ((uVar2 & 0x1002) == 2) {
        if ((uVar9 & 2) == 0) {
          bVar6 = ((pAVar10->flags6).Value & 0x80000) == 0;
        }
        else {
          bVar6 = false;
        }
      }
      if (((uVar9 >> 0xb & 1) != 0 && (uVar2 & 1) != 0) &&
         (dVar15 = ((pAVar10->__Pos).Z + pAVar10->Height) - pAVar10->MaxStepHeight,
         pdVar1 = &(other->__Pos).Z, *pdVar1 <= dVar15 && dVar15 != *pdVar1)) {
        P_TouchSpecialThing(other,pAVar10);
      }
      return (bool)(bVar14 | bVar6);
    }
    if (((other->flags2).Value & 0x4000000) != 0) {
      return (bool)1;
    }
    if (((uVar2 >> 0xe & 1) != 0) && (((other->flags3).Value & 8) != 0)) {
      return (bool)1;
    }
    if ((((pAVar10->flags6).Value & 4) != 0) &&
       (pAVar13 = (pAVar10->target).field_0.p, pAVar13 != (AActor *)0x0)) {
      if (((pAVar13->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0) {
        (*(((tm->thing->target).field_0.p)->super_DThinker).super_DObject._vptr_DObject[0x21])
                  (&local_a0);
        (*(other->super_DThinker).super_DObject._vptr_DObject[0x21])(&local_a4,other);
        if (local_a0.X._0_4_ == local_a4) {
          return (bool)1;
        }
      }
      else {
        (pAVar10->target).field_0.p = (AActor *)0x0;
      }
    }
    uVar9 = (other->flags).Value;
    if ((((uVar9 >> 0x14 & 1) != 0) && ((uVar9 & 4) == 0)) &&
       (((tm->thing->flags2).Value & 0x100) != 0)) {
      return (bool)1;
    }
    dVar15 = other->projectilepassheight;
    if (dVar15 <= 0.0) {
      if ((0.0 <= dVar15) || ((i_compatflags._2_1_ & 8) == 0)) {
        dVar15 = other->Height;
      }
      else {
        dVar15 = -dVar15;
      }
    }
    pAVar10 = tm->thing;
    dVar17 = (pAVar10->__Pos).Z;
    dVar18 = (other->__Pos).Z;
    if (dVar15 + dVar18 < dVar17) {
      return (bool)1;
    }
    if (dVar17 + pAVar10->Height < dVar18) {
      return (bool)1;
    }
    if ((((pAVar10->BounceFlags).Value & 8) != 0) &&
       ((pAVar10->Damage == (VMFunction *)0x0 || (((pAVar10->flags).Value & 0x10000) == 0)))) {
      pAVar13 = (pAVar10->target).field_0.p;
      if ((pAVar13 != (AActor *)0x0) &&
         (((pAVar13->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0)) {
        (pAVar10->target).field_0.p = (AActor *)0x0;
        pAVar13 = (AActor *)0x0;
      }
      if (pAVar13 == other) {
        return (bool)1;
      }
LAB_0050d3d9:
      return (uVar9 & 2) == 0;
    }
    iVar7 = (*(pAVar10->super_DThinker).super_DObject._vptr_DObject[0x16])(pAVar10,other);
    if (iVar7 != 0) {
      if (iVar7 == 1) {
        return (bool)1;
      }
      pAVar10 = (tm->thing->target).field_0.p;
      if (pAVar10 != (AActor *)0x0) {
        if (((pAVar10->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0) {
          pAVar10 = (tm->thing->target).field_0.p;
          if ((pAVar10 != (AActor *)0x0) &&
             (((pAVar10->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0)) {
            (tm->thing->target).field_0.p = (AActor *)0x0;
            pAVar10 = (AActor *)0x0;
          }
          if (other == pAVar10) {
            return (bool)1;
          }
          pAVar10 = (tm->thing->target).field_0.p;
          if ((pAVar10 != (AActor *)0x0) &&
             (((pAVar10->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0)) {
            (tm->thing->target).field_0.p = (AActor *)0x0;
            pAVar10 = (AActor *)0x0;
          }
          bVar6 = CanAttackHurt(other,pAVar10);
          if (!bVar6) {
            return (bool)0;
          }
        }
        else {
          (tm->thing->target).field_0.p = (AActor *)0x0;
        }
      }
      uVar9 = (other->flags).Value;
      if ((uVar9 & 4) == 0) goto LAB_0050d3d9;
      if ((((other->flags4).Value & 0x40000) != 0) && (((tm->thing->flags4).Value & 0x40000) == 0))
      {
        return (bool)1;
      }
      if ((tm->DoRipping == true) && (((other->flags5).Value & 0x80000) == 0)) {
        pAVar10 = tm->thing;
        if ((((other->RipLevelMin < 1) || (other->RipLevelMin <= pAVar10->RipperLevel)) &&
            ((other->RipLevelMax < 1 || (pAVar10->RipperLevel <= other->RipLevelMax)))) &&
           ((((pAVar10->flags6).Value & 1) == 0 || (((other->flags2).Value & 0x8000) == 0)))) {
          pNVar12 = (tm->LastRipped).Nodes + ((tm->LastRipped).Size - 1 & (uint)other);
          while ((pNVar11 = pNVar12, pNVar11 != (Node *)0x0 && (pNVar11->Next != (Node *)0x1))) {
            pNVar12 = pNVar11->Next;
            if ((pNVar11->Pair).Key == other) {
LAB_0050d693:
              if ((pNVar11 == (Node *)0x0) || ((pNVar11->Pair).Value == false)) {
                pNVar12 = TMap<AActor_*,_bool,_THashTraits<AActor_*>,_TValueTraits<bool>_>::GetNode
                                    (&tm->LastRipped,other);
                (pNVar12->Pair).Value = true;
                if ((((other->flags).Value & 0x80000) == 0) &&
                   ((uVar9 = (other->flags2).Value, -1 < (int)uVar9 &&
                    ((uVar9 & 0x18000000) == 0 && ((tm->thing->flags3).Value & 0x8000000) == 0)))) {
                  P_RipperBlood(tm->thing,other);
                }
                pAVar10 = tm->thing;
                local_68.ID = S_FindSound("misc/ripslop");
                S_Sound(pAVar10,4,&local_68,1.0,1.001);
                pAVar10 = tm->thing;
                if (0 < pAVar10->PoisonDamage) {
                  pAVar13 = (pAVar10->target).field_0.p;
                  if ((pAVar13 != (AActor *)0x0) &&
                     (((pAVar13->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0)) {
                    (pAVar10->target).field_0.p = (AActor *)0x0;
                    pAVar13 = (AActor *)0x0;
                  }
                  pAVar4 = tm->thing;
                  local_6c.Index = (pAVar4->PoisonDamageType).super_FName.Index;
                  P_PoisonMobj(other,pAVar10,pAVar13,pAVar4->PoisonDamage,pAVar4->PoisonDuration,
                               pAVar4->PoisonPeriod,&local_6c);
                }
                iVar7 = (*(tm->thing->super_DThinker).super_DObject._vptr_DObject[0x23])
                                  (tm->thing,3,2);
                pAVar10 = tm->thing;
                pAVar13 = (pAVar10->target).field_0.p;
                if ((pAVar13 != (AActor *)0x0) &&
                   (((pAVar13->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0)) {
                  (pAVar10->target).field_0.p = (AActor *)0x0;
                  pAVar13 = (AActor *)0x0;
                }
                local_70.Index = (tm->thing->DamageType).super_FName.Index;
                local_50.Degrees = 0.0;
                iVar8 = P_DamageMobj(other,pAVar10,pAVar13,iVar7,&local_70,0,&local_50);
                if (((tm->thing->flags3).Value & 0x8000000) == 0) {
                  if (0 < iVar8) {
                    iVar7 = iVar8;
                  }
                  P_TraceBleed(iVar7,other,tm->thing);
                }
                if (((((other->flags2).Value & 0x200) != 0) &&
                    (pAVar10 = tm->thing, ((pAVar10->flags2).Value & 0x2000) == 0)) &&
                   (iVar7 = tm->PushTime, other->lastpush != iVar7)) {
                  dVar15 = other->pushfactor;
                  dVar17 = (pAVar10->Vel).Y;
                  (other->Vel).X = (pAVar10->Vel).X * dVar15 + (other->Vel).X;
                  (other->Vel).Y = dVar15 * dVar17 + (other->Vel).Y;
                  other->lastpush = iVar7;
                }
              }
              if (spechit.Count == 0) {
                return (bool)1;
              }
              spechit.Count = 0;
              return (bool)1;
            }
          }
          pNVar11 = (Node *)0x0;
          goto LAB_0050d693;
        }
      }
      pAVar10 = tm->thing;
      if (0 < pAVar10->PoisonDamage) {
        pAVar13 = (pAVar10->target).field_0.p;
        if ((pAVar13 != (AActor *)0x0) &&
           (((pAVar13->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0)) {
          (pAVar10->target).field_0.p = (AActor *)0x0;
          pAVar13 = (AActor *)0x0;
        }
        pAVar4 = tm->thing;
        local_74.Index = (pAVar4->PoisonDamageType).super_FName.Index;
        P_PoisonMobj(other,pAVar10,pAVar13,pAVar4->PoisonDamage,pAVar4->PoisonDuration,
                     pAVar4->PoisonPeriod,&local_74);
      }
      pAVar10 = tm->thing;
      iVar7 = (*(pAVar10->super_DThinker).super_DObject._vptr_DObject[0x23])
                        (pAVar10,(ulong)((uint)(((pAVar10->flags4).Value >> 8 & 1) == 0) * 4 + 3),1)
      ;
      if (((iVar7 < 1) && (((tm->thing->flags6).Value & 8) == 0)) &&
         (((tm->thing->flags7).Value & 0x400) == 0)) {
        P_GiveBody(other,-iVar7,0);
      }
      else {
        pAVar10 = tm->thing;
        pAVar13 = (pAVar10->target).field_0.p;
        if ((pAVar13 != (AActor *)0x0) &&
           (((pAVar13->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0)) {
          (pAVar10->target).field_0.p = (AActor *)0x0;
          pAVar13 = (AActor *)0x0;
        }
        local_78.Index = (tm->thing->DamageType).super_FName.Index;
        local_58.Degrees = 0.0;
        iVar8 = P_DamageMobj(other,pAVar10,pAVar13,iVar7,&local_78,0,&local_58);
        if (0 < iVar7) {
          if ((((((tm->thing->flags5).Value & 0x100) != 0) &&
               (((other->flags).Value & 0x80000) == 0)) &&
              (((other->flags2).Value & 0x98000000) == 0)) &&
             ((((tm->thing->flags3).Value & 0x8000000) == 0 &&
              (uVar9 = FRandom::GenRand32(&pr_checkthing), (~uVar9 & 0xc0) != 0)))) {
            pAVar10 = tm->thing;
            local_a0.X = (pAVar10->__Pos).X;
            local_a0.Y = (pAVar10->__Pos).Y;
            local_a0.Z = (pAVar10->__Pos).Z;
            AActor::AngleTo((AActor *)local_80,pAVar10,SUB81(other,0));
            P_BloodSplatter(&local_a0,other,(DAngle *)local_80);
          }
          if (((tm->thing->flags3).Value & 0x8000000) == 0) {
            if (0 < iVar8) {
              iVar7 = iVar8;
            }
            P_TraceBleed(iVar7,other,tm->thing);
          }
        }
      }
      if (((((other->flags7).Value & 0x800) != 0) && ((int)(other->flags2).Value < 0)) &&
         (pAVar10 = tm->thing, ((pAVar10->flags).Value & 0x10000) != 0)) {
        if (((pAVar10->flags2).Value & 0x40000000) != 0) {
          (pAVar10->tracer).field_0 = (pAVar10->target).field_0;
        }
        (tm->thing->target).field_0.p = other;
        return (bool)1;
      }
    }
  }
  else {
    dVar15 = (pAVar10->Vel).Y;
    dVar17 = (pAVar10->Vel).X + (other->Vel).X;
    (other->Vel).X = dVar17;
    dVar15 = dVar15 + (other->Vel).Y;
    (other->Vel).Y = dVar15;
    if (3.0 < dVar15 + dVar17) {
      iVar7 = pAVar10->Mass / 100 + 1;
      local_60.Index = (pAVar10->DamageType).super_FName.Index;
      local_40.Degrees = 0.0;
      iVar8 = P_DamageMobj(other,pAVar10,pAVar10,iVar7,&local_60,0,&local_40);
      if (0 < iVar8) {
        iVar7 = iVar8;
      }
      P_TraceBleed(iVar7,other,tm->thing);
      iVar7 = other->Mass / 100 + 1;
      local_64.Index = (tm->thing->DamageType).super_FName.Index;
      local_48.Degrees = 0.0;
      iVar8 = P_DamageMobj(tm->thing,other,other,iVar7 >> 2,&local_64,0,&local_48);
      if (0 < iVar8) {
        iVar7 = iVar8;
      }
      P_TraceBleed(iVar7,tm->thing,other);
      return (bool)0;
    }
  }
  return false;
}

Assistant:

bool PIT_CheckThing(FMultiBlockThingsIterator &it, FMultiBlockThingsIterator::CheckResult &cres, const FBoundingBox &box, FCheckPosition &tm)
{
	AActor *thing = cres.thing;
	double topz;
	bool 	solid;
	int 	damage;

	// don't clip against self
	if (thing == tm.thing)
		return true;

	if (!((thing->flags & (MF_SOLID | MF_SPECIAL | MF_SHOOTABLE)) || thing->flags6 & MF6_TOUCHY))
		return true;	// can't hit thing

	double blockdist = thing->radius + tm.thing->radius;
	if (fabs(thing->X() - cres.Position.X) >= blockdist || fabs(thing->Y() - cres.Position.Y) >= blockdist)
		return true;

	if ((thing->flags2 | tm.thing->flags2) & MF2_THRUACTORS)
		return true;

	if ((tm.thing->flags6 & MF6_THRUSPECIES) && (tm.thing->GetSpecies() == thing->GetSpecies()))
		return true;

	tm.thing->BlockingMobj = thing;
	topz = thing->Top();

	// Both things overlap in x or y direction
	bool unblocking = false;

	// walking on other actors and unblocking is too messy through restricted portal types so disable it.
	if (!(cres.portalflags & FFCF_RESTRICTEDPORTAL))
	{
		if (!(i_compatflags & COMPATF_NO_PASSMOBJ) && !(tm.thing->flags & (MF_FLOAT | MF_MISSILE | MF_SKULLFLY | MF_NOGRAVITY)) &&
			(thing->flags & MF_SOLID) && (thing->flags4 & MF4_ACTLIKEBRIDGE))
		{
			// [RH] Let monsters walk on actors as well as floors
			if ((tm.thing->flags3 & MF3_ISMONSTER) &&
				topz >= tm.floorz && topz <= tm.thing->Z() + tm.thing->MaxStepHeight)
			{
				// The commented-out if is an attempt to prevent monsters from walking off a
				// thing further than they would walk off a ledge. I can't think of an easy
				// way to do this, so I restrict them to only walking on bridges instead.
				// Uncommenting the if here makes it almost impossible for them to walk on
				// anything, bridge or otherwise.
				//			if (abs(thing->x - tmx) <= thing->radius &&
				//				abs(thing->y - tmy) <= thing->radius)
				{
					tm.stepthing = thing;
					tm.floorz = topz;
				}
			}
		}

		if (((tm.FromPMove || tm.thing->player != NULL) && thing->flags&MF_SOLID))
		{
			DVector3 oldpos = tm.thing->PosRelative(thing);
			// Both actors already overlap. To prevent them from remaining stuck allow the move if it
			// takes them further apart or the move does not change the position (when called from P_ChangeSector.)
			if (tm.pos.X == tm.thing->X() && tm.pos.Y == tm.thing->Y())
			{
				unblocking = true;
			}
			else if (fabs(thing->X() - oldpos.X) < (thing->radius + tm.thing->radius) &&
				fabs(thing->Y() - oldpos.Y) < (thing->radius + tm.thing->radius))

			{
				double newdist = thing->Distance2D(cres.Position.X, cres.Position.Y);
				double olddist = thing->Distance2D(oldpos.X, oldpos.Y);

				if (newdist > olddist)
				{
					// unblock only if there's already a vertical overlap (or both actors are flagged not to overlap)
					unblocking = (tm.thing->Top() > thing->Z() && tm.thing->Z() < topz) || (tm.thing->flags3 & thing->flags3 & MF3_DONTOVERLAP);
				}
			}
		}
	}

	// [RH] If the other thing is a bridge, then treat the moving thing as if it had MF2_PASSMOBJ, so
	// you can use a scrolling floor to move scenery items underneath a bridge.
	if ((tm.thing->flags2 & MF2_PASSMOBJ || thing->flags4 & MF4_ACTLIKEBRIDGE) && !(i_compatflags & COMPATF_NO_PASSMOBJ))
	{ // check if a mobj passed over/under another object
		if (!(tm.thing->flags & MF_MISSILE) ||
			!(tm.thing->flags2 & MF2_RIP) ||
			(thing->flags5 & MF5_DONTRIP) ||
			((tm.thing->flags6 & MF6_NOBOSSRIP) && (thing->flags2 & MF2_BOSS)))
		{
			if (tm.thing->flags3 & thing->flags3 & MF3_DONTOVERLAP)
			{ // Some things prefer not to overlap each other, if possible
				return unblocking;
			}
			if ((tm.thing->Z() >= topz) || (tm.thing->Top() <= thing->Z()))
				return true;
		}
	}

	if (tm.thing->player == NULL || !(tm.thing->player->cheats & CF_PREDICTING))
	{
		// touchy object is alive, toucher is solid
		if (thing->flags6 & MF6_TOUCHY && tm.thing->flags & MF_SOLID && thing->health > 0 &&
			// Thing is an armed mine or a sentient thing
			(thing->flags6 & MF6_ARMED || thing->IsSentient()) &&
			// either different classes or players
			(thing->player || thing->GetClass() != tm.thing->GetClass()) &&
			// or different species if DONTHARMSPECIES
			(!(thing->flags6 & MF6_DONTHARMSPECIES) || thing->GetSpecies() != tm.thing->GetSpecies()) &&
			// touches vertically
			topz >= tm.thing->Z() && tm.thing->Top() >= thing->Z() &&
			// prevents lost souls from exploding when fired by pain elementals
			(thing->master != tm.thing && tm.thing->master != thing))
			// Difference with MBF: MBF hardcodes the LS/PE check and lets actors of the same species
			// but different classes trigger the touchiness, but that seems less straightforwards.
		{
			thing->flags6 &= ~MF6_ARMED; // Disarm
			P_DamageMobj(thing, NULL, NULL, thing->health, NAME_None, DMG_FORCED);  // kill object
			return true;
		}

		// Check for MF6_BUMPSPECIAL
		// By default, only players can activate things by bumping into them
		if ((thing->flags6 & MF6_BUMPSPECIAL) && ((tm.thing->player != NULL)
			|| ((thing->activationtype & THINGSPEC_MonsterTrigger) && (tm.thing->flags3 & MF3_ISMONSTER))
			|| ((thing->activationtype & THINGSPEC_MissileTrigger) && (tm.thing->flags & MF_MISSILE))
			) && (level.maptime > thing->lastbump)) // Leave the bumper enough time to go away
		{
			if (P_ActivateThingSpecial(thing, tm.thing))
				thing->lastbump = level.maptime + TICRATE;
		}
	}

	// Check for skulls slamming into things
	if (tm.thing->flags & MF_SKULLFLY)
	{
		bool res = tm.thing->Slam(tm.thing->BlockingMobj);
		tm.thing->BlockingMobj = NULL;
		return res;
	}

	// [ED850] Player Prediction ends here. There is nothing else they could/should do.
	if (tm.thing->player != NULL && (tm.thing->player->cheats & CF_PREDICTING))
	{
		solid = (thing->flags & MF_SOLID) &&
			!(thing->flags & MF_NOCLIP) &&
			((tm.thing->flags & MF_SOLID) || (tm.thing->flags6 & MF6_BLOCKEDBYSOLIDACTORS));

		return !solid || unblocking;
	}

	// Check for blasted thing running into another
	if ((tm.thing->flags2 & MF2_BLASTED) && (thing->flags & MF_SHOOTABLE))
	{
		if (!(thing->flags2 & MF2_BOSS) && (thing->flags3 & MF3_ISMONSTER) && !(thing->flags3 & MF3_DONTBLAST))
		{
			// ideally this should take the mass factor into account
			thing->Vel += tm.thing->Vel.XY();
			if ((thing->Vel.X + thing->Vel.Y) > 3.)
			{
				int newdam;
				damage = (tm.thing->Mass / 100) + 1;
				newdam = P_DamageMobj(thing, tm.thing, tm.thing, damage, tm.thing->DamageType);
				P_TraceBleed(newdam > 0 ? newdam : damage, thing, tm.thing);
				damage = (thing->Mass / 100) + 1;
				newdam = P_DamageMobj(tm.thing, thing, thing, damage >> 2, tm.thing->DamageType);
				P_TraceBleed(newdam > 0 ? newdam : damage, tm.thing, thing);
			}
			return false;
		}
	}
	// Check for missile or non-solid MBF bouncer
	if (tm.thing->flags & MF_MISSILE || ((tm.thing->BounceFlags & BOUNCE_MBF) && !(tm.thing->flags & MF_SOLID)))
	{
		// Check for a non-shootable mobj
		if (thing->flags2 & MF2_NONSHOOTABLE)
		{
			return true;
		}
		// Check for passing through a ghost
		if ((thing->flags3 & MF3_GHOST) && (tm.thing->flags2 & MF2_THRUGHOST))
		{
			return true;
		}

		if ((tm.thing->flags6 & MF6_MTHRUSPECIES)
			&& tm.thing->target // NULL pointer check
			&& (tm.thing->target->GetSpecies() == thing->GetSpecies()))
			return true;

		// Check for rippers passing through corpses
		if ((thing->flags & MF_CORPSE) && (tm.thing->flags2 & MF2_RIP) && !(thing->flags & MF_SHOOTABLE))
		{
			return true;
		}

		double clipheight;

		if (thing->projectilepassheight > 0)
		{
			clipheight = thing->projectilepassheight;
		}
		else if (thing->projectilepassheight < 0 && (i_compatflags & COMPATF_MISSILECLIP))
		{
			clipheight = -thing->projectilepassheight;
		}
		else
		{
			clipheight = thing->Height;
		}

		// Check if it went over / under
		if (tm.thing->Z() > thing->Z() + clipheight)
		{ // Over thing
			return true;
		}
		if (tm.thing->Top() < thing->Z())
		{ // Under thing
			return true;
		}

		// [RH] What is the point of this check, again? In Hexen, it is unconditional,
		// but here we only do it if the missile's damage is 0.
		// MBF bouncer might have a non-0 damage value, but they must not deal damage on impact either.
		if ((tm.thing->BounceFlags & BOUNCE_Actors) && (tm.thing->Damage == 0 || !(tm.thing->flags & MF_MISSILE)))
		{
			return (tm.thing->target == thing || !(thing->flags & MF_SOLID));
		}

		switch (tm.thing->SpecialMissileHit(thing))
		{
		case 0:		return false;
		case 1:		return true;
		default:	break;
		}

		// [RH] Extend DeHacked infighting to allow for monsters
		// to never fight each other

		if (tm.thing->target != NULL)
		{
			if (thing == tm.thing->target)
			{ // Don't missile self
				return true;
			}

			if (!CanAttackHurt(thing, tm.thing->target))
			{
				return false;
			}
		}
		if (!(thing->flags & MF_SHOOTABLE))
		{ // Didn't do any damage
			return !(thing->flags & MF_SOLID);
		}
		if ((thing->flags4 & MF4_SPECTRAL) && !(tm.thing->flags4 & MF4_SPECTRAL))
		{
			return true;
		}

		if ((tm.DoRipping && !(thing->flags5 & MF5_DONTRIP)) && CheckRipLevel(thing, tm.thing))
		{
			if (!(tm.thing->flags6 & MF6_NOBOSSRIP) || !(thing->flags2 & MF2_BOSS))
			{
				bool *check = tm.LastRipped.CheckKey(thing);
				if (check == NULL || !*check)
				{
					tm.LastRipped[thing] = true;
					if (!(thing->flags & MF_NOBLOOD) &&
						!(thing->flags2 & MF2_REFLECTIVE) &&
						!(tm.thing->flags3 & MF3_BLOODLESSIMPACT) &&
						!(thing->flags2 & (MF2_INVULNERABLE | MF2_DORMANT)))
					{ // Ok to spawn blood
						P_RipperBlood(tm.thing, thing);
					}
					S_Sound(tm.thing, CHAN_BODY, "misc/ripslop", 1, ATTN_IDLE);

					// Do poisoning (if using new style poison)
					if (tm.thing->PoisonDamage > 0 && tm.thing->PoisonDuration != INT_MIN)
					{
						P_PoisonMobj(thing, tm.thing, tm.thing->target, tm.thing->PoisonDamage, tm.thing->PoisonDuration, tm.thing->PoisonPeriod, tm.thing->PoisonDamageType);
					}

					damage = tm.thing->GetMissileDamage(3, 2);
					int newdam = P_DamageMobj(thing, tm.thing, tm.thing->target, damage, tm.thing->DamageType);
					if (!(tm.thing->flags3 & MF3_BLOODLESSIMPACT))
					{
						P_TraceBleed(newdam > 0 ? newdam : damage, thing, tm.thing);
					}
					if (thing->flags2 & MF2_PUSHABLE
						&& !(tm.thing->flags2 & MF2_CANNOTPUSH))
					{ // Push thing
						if (thing->lastpush != tm.PushTime)
						{
							thing->Vel += tm.thing->Vel.XY() * thing->pushfactor;
							thing->lastpush = tm.PushTime;
						}
					}
				}
				spechit.Clear();
				return true;
			}
		}

		// Do poisoning (if using new style poison)
		if (tm.thing->PoisonDamage > 0 && tm.thing->PoisonDuration != INT_MIN)
		{
			P_PoisonMobj(thing, tm.thing, tm.thing->target, tm.thing->PoisonDamage, tm.thing->PoisonDuration, tm.thing->PoisonPeriod, tm.thing->PoisonDamageType);
		}

		// Do damage
		damage = tm.thing->GetMissileDamage((tm.thing->flags4 & MF4_STRIFEDAMAGE) ? 3 : 7, 1);
		if ((damage > 0) || (tm.thing->flags6 & MF6_FORCEPAIN) || (tm.thing->flags7 & MF7_CAUSEPAIN))
		{
			int newdam = P_DamageMobj(thing, tm.thing, tm.thing->target, damage, tm.thing->DamageType);
			if (damage > 0)
			{
				if ((tm.thing->flags5 & MF5_BLOODSPLATTER) &&
					!(thing->flags & MF_NOBLOOD) &&
					!(thing->flags2 & MF2_REFLECTIVE) &&
					!(thing->flags2 & (MF2_INVULNERABLE | MF2_DORMANT)) &&
					!(tm.thing->flags3 & MF3_BLOODLESSIMPACT) &&
					(pr_checkthing() < 192))
				{
					P_BloodSplatter(tm.thing->Pos(), thing, tm.thing->AngleTo(thing));
				}
				if (!(tm.thing->flags3 & MF3_BLOODLESSIMPACT))
				{
					P_TraceBleed(newdam > 0 ? newdam : damage, thing, tm.thing);
				}
			}
		}
		else
		{
			P_GiveBody(thing, -damage);
		}

		if ((thing->flags7 & MF7_THRUREFLECT) && (thing->flags2 & MF2_REFLECTIVE) && (tm.thing->flags & MF_MISSILE))
		{
			if (tm.thing->flags2 & MF2_SEEKERMISSILE)
			{
				tm.thing->tracer = tm.thing->target;
			}
			tm.thing->target = thing;
			return true;
		}
		return false;		// don't traverse any more
	}
	if (thing->flags2 & MF2_PUSHABLE && !(tm.thing->flags2 & MF2_CANNOTPUSH))
	{ // Push thing
		if (thing->lastpush != tm.PushTime)
		{
			thing->Vel += tm.thing->Vel.XY() * thing->pushfactor;
			thing->lastpush = tm.PushTime;
		}
	}
	solid = (thing->flags & MF_SOLID) &&
		!(thing->flags & MF_NOCLIP) &&
		((tm.thing->flags & MF_SOLID) || (tm.thing->flags6 & MF6_BLOCKEDBYSOLIDACTORS));

	// Check for special pickup
	if ((thing->flags & MF_SPECIAL) && (tm.thing->flags & MF_PICKUP)
		// [RH] The next condition is to compensate for the extra height
		// that gets added by P_CheckPosition() so that you cannot pick
		// up things that are above your true height.
		&& thing->Z() < tm.thing->Top() - tm.thing->MaxStepHeight)
	{ // Can be picked up by tmthing
		P_TouchSpecialThing(thing, tm.thing);	// can remove thing
	}

	// killough 3/16/98: Allow non-solid moving objects to move through solid
	// ones, by allowing the moving thing (tmthing) to move if it's non-solid,
	// despite another solid thing being in the way.
	// killough 4/11/98: Treat no-clipping things as not blocking

	return !solid || unblocking;

	// return !(thing->flags & MF_SOLID);	// old code -- killough
}